

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O3

void __thiscall
spvtools::opt::Loop::GetMergingBlocks
          (Loop *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *merging_blocks)

{
  IRContext *this_00;
  Instruction *pIVar1;
  uint32_t *puVar2;
  uint32_t uVar3;
  uint32_t blk_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  const_iterator cVar5;
  __hashtable *__h;
  BasicBlock *pBVar6;
  uint32_t *puVar7;
  uint32_t pred_id;
  stack<const_spvtools::opt::BasicBlock_*,_std::deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>
  to_visit;
  uint32_t local_9c;
  BasicBlock *local_98;
  CFG *local_90;
  _Deque_base<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
  local_88;
  
  if (this->loop_merge_ != (BasicBlock *)0x0) {
    this_00 = this->context_;
    if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(this_00);
    }
    local_90 = (this_00->cfg_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
               _M_t.
               super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
               .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear(&merging_blocks->_M_h);
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::
    _Deque_base<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
    ::_M_initialize_map(&local_88,0);
    local_98 = this->loop_merge_;
    std::deque<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>::
    emplace_back<spvtools::opt::BasicBlock_const*>
              ((deque<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>
                *)&local_88,&local_98);
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pBVar6 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
          operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          pBVar6 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        pIVar1 = (pBVar6->label_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        blk_id = 0;
        uVar3 = 0;
        if (pIVar1->has_result_id_ == true) {
          uVar3 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
        }
        local_9c = uVar3;
        local_98 = (BasicBlock *)merging_blocks;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)merging_blocks,&local_9c,&local_98);
        pIVar1 = (pBVar6->label_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        if (pIVar1->has_result_id_ == true) {
          blk_id = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
        }
        pvVar4 = CFG::preds(local_90,blk_id);
        puVar2 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar7 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2;
            puVar7 = puVar7 + 1) {
          local_9c = *puVar7;
          local_98 = (BasicBlock *)CONCAT44(local_98._4_4_,local_9c);
          cVar5 = std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find(&(this->loop_basic_blocks_)._M_h,(key_type_conflict *)&local_98);
          if (cVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
            cVar5 = std::
                    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find(&merging_blocks->_M_h,&local_9c);
            if (cVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
              local_98 = CFG::block(local_90,local_9c);
              std::
              deque<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>
              ::emplace_back<spvtools::opt::BasicBlock_const*>
                        ((deque<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>
                          *)&local_88,&local_98);
            }
          }
        }
      } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    std::
    _Deque_base<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
    ::~_Deque_base(&local_88);
    return;
  }
  __assert_fail("GetMergeBlock() && \"This loop is not structured\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                ,0x170,
                "void spvtools::opt::Loop::GetMergingBlocks(std::unordered_set<uint32_t> *) const");
}

Assistant:

void Loop::GetMergingBlocks(
    std::unordered_set<uint32_t>* merging_blocks) const {
  assert(GetMergeBlock() && "This loop is not structured");
  CFG* cfg = context_->cfg();
  merging_blocks->clear();

  std::stack<const BasicBlock*> to_visit;
  to_visit.push(GetMergeBlock());
  while (!to_visit.empty()) {
    const BasicBlock* bb = to_visit.top();
    to_visit.pop();
    merging_blocks->insert(bb->id());
    for (uint32_t pred_id : cfg->preds(bb->id())) {
      if (!IsInsideLoop(pred_id) && !merging_blocks->count(pred_id)) {
        to_visit.push(cfg->block(pred_id));
      }
    }
  }
}